

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

ForNonContainerNonPointer<my_error,_std::string> * __thiscall
lest::to_string<__lest_function__1822(lest::env&)::my_error>
          (ForNonContainerNonPointer<my_error,_std::string> *__return_storage_ptr__,lest *this,
          my_error *item)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  string local_38;
  int local_14;
  
  local_14 = *(int *)this;
  make_value_string<int>(&local_38,&local_14);
  paVar1 = &local_38.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == paVar1) {
    local_48._8_8_ = local_38.field_2._8_8_;
    local_58 = &local_48;
  }
  else {
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_38._M_dataplus._M_p;
  }
  if (local_58 == &local_48) {
    local_38.field_2._8_8_ = local_48._8_8_;
    local_38._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_38._M_dataplus._M_p = (pointer)local_58;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == paVar1) {
    local_48._8_8_ = local_38.field_2._8_8_;
    local_58 = &local_48;
  }
  else {
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_38._M_dataplus._M_p;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_58 == &local_48) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_38.field_2._M_allocated_capacity
    ;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_48._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_38.field_2._M_allocated_capacity
    ;
  }
  __return_storage_ptr__->_M_string_length = local_38._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

auto to_string( T const & item ) -> ForNonContainerNonPointer<T, std::string>
{
    return make_string( item );
}